

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O0

void __thiscall
anurbs::PolylineMapper<3L>::PolylineMapper
          (PolylineMapper<3L> *this,
          vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
          *points)

{
  Index IVar1;
  const_reference pvVar2;
  Matrix<double,_1,_3,_1,_1,_3> local_90;
  Matrix<double,_1,_3,_1,_1,_3> local_78;
  undefined1 local_60 [8];
  Vector box_b;
  Vector box_a;
  Index i;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *points_local;
  PolylineMapper<3L> *this_local;
  
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::vector(&this->m_points,points);
  IVar1 = length<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>>
                    (points);
  RTree<3L>::RTree(&this->m_rtree,IVar1 + -1,0x10);
  box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  while( true ) {
    IVar1 = length<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>>
                      (points);
    if (IVar1 <= (long)box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                       m_data.array[2]) break;
    pvVar2 = std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](points,(long)box_a.
                                       super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                       m_storage.m_data.array[2] - 1);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
              ((Matrix<double,_1,_3,_1,_1,_3> *)
               (box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2),pvVar2);
    pvVar2 = std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](points,(size_type)
                                 box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                 m_storage.m_data.array[2]);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)local_60,pvVar2);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
              (&local_78,
               (Matrix<double,_1,_3,_1,_1,_3> *)
               (box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
              (&local_90,(Matrix<double,_1,_3,_1,_1,_3> *)local_60);
    RTree<3L>::add(&this->m_rtree,&local_78,&local_90);
    box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
         (double)((long)box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                        .m_data.array[2] + 1);
  }
  RTree<3L>::finish(&this->m_rtree,false);
  return;
}

Assistant:

PolylineMapper(const std::vector<Vector>& points)
    : m_points(points)
    , m_rtree(length(points) - 1)
    {
        for (Index i = 1; i < length(points); i++) {
            Vector box_a = points[i - 1];
            Vector box_b = points[i];

            m_rtree.add(box_a, box_b);
        }

        m_rtree.finish(false);
    }